

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlCreateInputBuffer(PyObject *self,PyObject *args)

{
  int iVar1;
  uint uVar2;
  xmlParserInputBufferPtr buffer;
  PyObject *pPVar3;
  xmlChar *encoding;
  PyObject *file;
  char *local_20;
  void *local_18;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Oz:xmlParserInputBufferCreate",&local_18,&local_20);
  if (iVar1 != 0) {
    if ((local_20 != (char *)0x0) && (*local_20 != '\0')) {
      uVar2 = xmlParseCharEncoding();
      pPVar3 = (PyObject *)(ulong)uVar2;
    }
    if (local_18 == (void *)0x0) {
      buffer = (xmlParserInputBufferPtr)0x0;
    }
    else {
      buffer = (xmlParserInputBufferPtr)xmlAllocParserInputBuffer(pPVar3);
      if (buffer != (xmlParserInputBufferPtr)0x0) {
        buffer->context = local_18;
        buffer->readcallback = xmlPythonFileRead;
        buffer->closecallback = xmlPythonFileClose;
      }
    }
    if (buffer == (xmlParserInputBufferPtr)0x0) {
      puts("libxml_xmlParserInputBufferCreate: buffer == NULL");
    }
    pPVar3 = libxml_xmlParserInputBufferPtrWrap(buffer);
  }
  return pPVar3;
}

Assistant:

PyObject *
libxml_xmlCreateInputBuffer(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    PyObject *py_retval;
    PyObject *file;
    xmlChar  *encoding;
    xmlCharEncoding enc = XML_CHAR_ENCODING_NONE;
    xmlParserInputBufferPtr buffer;


    if (!PyArg_ParseTuple(args, (char *)"Oz:xmlParserInputBufferCreate",
		&file, &encoding))
	return(NULL);
    if ((encoding != NULL) && (encoding[0] != 0)) {
	enc = xmlParseCharEncoding((const char *) encoding);
    }
    buffer = xmlParserInputBufferCreatePythonFile(file, enc);
    if (buffer == NULL)
	printf("libxml_xmlParserInputBufferCreate: buffer == NULL\n");
    py_retval = libxml_xmlParserInputBufferPtrWrap(buffer);
    return(py_retval);
}